

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImU32 ImGui::ColorConvertFloat4ToU32(ImVec4 *in)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float *in_RDI;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  ImU32 out;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  
  auVar5._0_4_ = ImSaturate(*in_RDI);
  auVar5._4_60_ = extraout_var;
  auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x437f0000),0),auVar5._0_16_,
                           SUB6416(ZEXT464(0x3f000000),0));
  auVar6._0_4_ = ImSaturate(in_RDI[1]);
  auVar6._4_60_ = extraout_var_00;
  auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0x437f0000),0),auVar6._0_16_,
                           SUB6416(ZEXT464(0x3f000000),0));
  auVar7._0_4_ = ImSaturate(in_RDI[2]);
  auVar7._4_60_ = extraout_var_01;
  auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0x437f0000),0),auVar7._0_16_,
                           SUB6416(ZEXT464(0x3f000000),0));
  auVar8._0_4_ = ImSaturate(in_RDI[3]);
  auVar8._4_60_ = extraout_var_02;
  auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0x437f0000),0),auVar8._0_16_,
                           SUB6416(ZEXT464(0x3f000000),0));
  return (int)auVar4._0_4_ << 0x18 |
         (int)auVar3._0_4_ << 0x10 | (int)auVar2._0_4_ << 8 | (int)auVar1._0_4_;
}

Assistant:

ImU32 ImGui::ColorConvertFloat4ToU32(const ImVec4& in)
{
    ImU32 out;
    out  = ((ImU32)IM_F32_TO_INT8_SAT(in.x)) << IM_COL32_R_SHIFT;
    out |= ((ImU32)IM_F32_TO_INT8_SAT(in.y)) << IM_COL32_G_SHIFT;
    out |= ((ImU32)IM_F32_TO_INT8_SAT(in.z)) << IM_COL32_B_SHIFT;
    out |= ((ImU32)IM_F32_TO_INT8_SAT(in.w)) << IM_COL32_A_SHIFT;
    return out;
}